

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

bool wallet::BindBlobToStatement
               (sqlite3_stmt *stmt,int index,Span<const_std::byte> blob,string *description)

{
  string_view source_file;
  int iVar1;
  byte *pbVar2;
  size_t sVar3;
  size_t in_RCX;
  ConstevalFormatString<2U> in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  LogFlags in_R8;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  int res;
  Level in_stack_000000e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000f0;
  char **in_stack_000000f8;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  byte *local_88;
  int source_line;
  char *pcVar4;
  
  pcVar4 = *(char **)(in_FS_OFFSET + 0x28);
  source_line = in_ESI;
  pbVar2 = Span<const_std::byte>::data
                     ((Span<const_std::byte> *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (pbVar2 == (byte *)0x0) {
    local_88 = (byte *)0x9acb7d;
  }
  else {
    local_88 = Span<const_std::byte>::data
                         ((Span<const_std::byte> *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  sVar3 = Span<const_std::byte>::size
                    ((Span<const_std::byte> *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  iVar1 = sqlite3_bind_blob(in_RDI,in_ESI,local_88,sVar3 & 0xffffffff,0);
  if (iVar1 != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    sqlite3_errstr(iVar1);
    source_file._M_str = pcVar4;
    source_file._M_len = in_RCX;
    LogPrintFormatInternal<std::__cxx11::string,char_const*>
              (in_stack_00000000,source_file,source_line,in_R8,in_stack_000000e0,in_RDX,
               in_stack_000000f0,in_stack_000000f8);
    sqlite3_clear_bindings(in_RDI);
    sqlite3_reset(in_RDI);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar4) {
    __stack_chk_fail();
  }
  return iVar1 == 0;
}

Assistant:

static bool BindBlobToStatement(sqlite3_stmt* stmt,
                                int index,
                                Span<const std::byte> blob,
                                const std::string& description)
{
    // Pass a pointer to the empty string "" below instead of passing the
    // blob.data() pointer if the blob.data() pointer is null. Passing a null
    // data pointer to bind_blob would cause sqlite to bind the SQL NULL value
    // instead of the empty blob value X'', which would mess up SQL comparisons.
    int res = sqlite3_bind_blob(stmt, index, blob.data() ? static_cast<const void*>(blob.data()) : "", blob.size(), SQLITE_STATIC);
    if (res != SQLITE_OK) {
        LogPrintf("Unable to bind %s to statement: %s\n", description, sqlite3_errstr(res));
        sqlite3_clear_bindings(stmt);
        sqlite3_reset(stmt);
        return false;
    }

    return true;
}